

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumConstantOptions
          (Parser *this,EnumValueDescriptorProto *value,LocationRecorder *enum_value_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  bool bVar2;
  EnumValueOptions *options;
  LocationRecorder location;
  
  bVar1 = LookingAt(this,"[");
  bVar2 = true;
  if (bVar1) {
    LocationRecorder::LocationRecorder(&location,enum_value_location,3);
    bVar1 = Consume(this,"[");
    if (bVar1) {
      do {
        options = EnumValueDescriptorProto::mutable_options(value);
        bVar1 = ParseOption(this,&options->super_Message,&location,containing_file,OPTION_ASSIGNMENT
                           );
        if (!bVar1) goto LAB_002d8f60;
        bVar1 = TryConsume(this,",");
      } while (bVar1);
      bVar2 = Consume(this,"]");
    }
    else {
LAB_002d8f60:
      bVar2 = false;
    }
    LocationRecorder::~LocationRecorder(&location);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseEnumConstantOptions(
    EnumValueDescriptorProto* value,
    const LocationRecorder& enum_value_location,
    const FileDescriptorProto* containing_file) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(
      enum_value_location, EnumValueDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  do {
    DO(ParseOption(value->mutable_options(), location,
                   containing_file, OPTION_ASSIGNMENT));
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}